

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<QString> args;
  bool bVar1;
  QListSpecialMethods<QString> *this;
  qsizetype qVar2;
  QList<VkSpecParser::Command> *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  int i;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_3;
  QString outputBase;
  QString licenseHeaderFileName;
  QStringList ignoredFuncs;
  QMap<QString,_QList<QString>_> versionCommandMapping;
  QList<VkSpecParser::Command> commands;
  VkSpecParser parser;
  QCoreApplication app;
  undefined4 in_stack_fffffffffffffd28;
  CaseSensitivity in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  QList<QString> *in_stack_fffffffffffffd38;
  VkSpecParser *in_stack_fffffffffffffd40;
  undefined1 *puVar6;
  QByteArrayView *local_298;
  int local_28c;
  QString *outputBase_00;
  QString *licHeaderFn;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 uVar7;
  int iVar8;
  char16_t *versionCommandMapping_00;
  char16_t *commands_00;
  char16_t *outputBase_01;
  char16_t *licHeaderFn_00;
  QArrayDataPointer<char16_t> *versionCommandMapping_01;
  QList<VkSpecParser::Command> *in_stack_fffffffffffffe00;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  storage_type *local_1d8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  QArrayDataPointer<char16_t> local_1b0;
  QArrayDataPointer<char16_t> local_198;
  QArrayDataPointer<char16_t> local_180;
  QArrayDataPointer<char16_t> local_168;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  QList<VkSpecParser::Command> local_130;
  storage_type *local_118;
  undefined1 local_108 [24];
  char local_f0 [32];
  undefined1 local_d0 [80];
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  QString local_68;
  undefined1 auStack_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  local_80 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  local_6c = in_EDI;
  QCoreApplication::QCoreApplication
            ((QCoreApplication *)&local_80,&local_6c,(char **)in_RSI,0x60a00);
  memset(local_d0,0xaa,0x50);
  VkSpecParser::VkSpecParser
            ((VkSpecParser *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  if (local_6c < 4) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd34,
               (char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QMessageLogger::warning
              (local_f0,
               "Usage: qvkgen input_vk_xml input_license_header output_base\n  For example: qvkgen vulkan/vk.xml vulkan/qvulkanfunctions.header vulkan/qvulkanfunctions"
              );
    iVar8 = 1;
  }
  else {
    QByteArrayView::QByteArrayView<char_*,_true>
              ((QByteArrayView *)in_stack_fffffffffffffd40,(char **)in_stack_fffffffffffffd38);
    QVar3.m_data = local_118;
    QVar3.m_size = (qsizetype)local_108;
    QString::fromUtf8(QVar3);
    VkSpecParser::setFileName
              ((VkSpecParser *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               (QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QString::~QString((QString *)0x107911);
    bVar1 = VkSpecParser::parse(in_stack_fffffffffffffd40);
    if (bVar1) {
      local_130.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_130.d.ptr = (Command *)0xaaaaaaaaaaaaaaaa;
      local_130.d.size = -0x5555555555555556;
      VkSpecParser::commands
                ((VkSpecParser *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      local_138 = 0xaaaaaaaaaaaaaaaa;
      VkSpecParser::versionCommandMapping
                ((VkSpecParser *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      local_150 = 0xaaaaaaaaaaaaaaaa;
      local_148 = 0xaaaaaaaaaaaaaaaa;
      local_140 = 0xaaaaaaaaaaaaaaaa;
      commands_00 = L"vkCreateInstance";
      versionCommandMapping_00 = L"vkCreateInstance";
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_168,(Data *)0x0,L"vkCreateInstance",0x10);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      puVar6 = auStack_50;
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_180,(Data *)0x0,L"vkDestroyInstance",0x11);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_198,(Data *)0x0,L"vkGetInstanceProcAddr",0x15);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      versionCommandMapping_01 = &local_1b0;
      licHeaderFn_00 = L"vkEnumerateInstanceVersion";
      outputBase_01 = L"vkEnumerateInstanceVersion";
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (&local_1b0,(Data *)0x0,L"vkEnumerateInstanceVersion",0x1a);
      QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
      ;
      outputBase_00 = &local_68;
      licHeaderFn = (QString *)0x4;
      args._M_len = (size_type)puVar6;
      args._M_array = (iterator)in_stack_fffffffffffffd40;
      QList<QString>::QList(in_stack_fffffffffffffd38,args);
      local_298 = (QByteArrayView *)&stack0xfffffffffffffff8;
      do {
        local_298 = (QByteArrayView *)&local_298[-2].m_data;
        QString::~QString((QString *)0x107bcc);
      } while (local_298 != (QByteArrayView *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      local_28c = 0;
      while( true ) {
        this = (QListSpecialMethods<QString> *)(long)local_28c;
        qVar2 = QList<VkSpecParser::Command>::size(&local_130);
        if (qVar2 <= (long)this) break;
        QList<VkSpecParser::Command>::operator[]
                  ((QList<VkSpecParser::Command> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        bVar1 = QListSpecialMethods<QString>::contains
                          (this,(QString *)
                                CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                           in_stack_fffffffffffffd2c);
        if (bVar1) {
          QList<VkSpecParser::Command>::remove(&local_130,(char *)(long)local_28c);
          local_28c = local_28c + -1;
        }
        local_28c = local_28c + 1;
      }
      local_1c8 = 0xaaaaaaaaaaaaaaaa;
      local_1c0 = 0xaaaaaaaaaaaaaaaa;
      local_1b8 = 0xaaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<char_*,_true>(local_298,(char **)this);
      QVar4.m_data = local_1d8;
      QVar4.m_size = (qsizetype)&local_1c8;
      QString::fromUtf8(QVar4);
      local_1f0 = 0xaaaaaaaaaaaaaaaa;
      local_1e8 = 0xaaaaaaaaaaaaaaaa;
      local_1e0 = 0xaaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<char_*,_true>(local_298,(char **)this);
      QVar5.m_data = (storage_type *)in_stack_fffffffffffffe00;
      QVar5.m_size = (qsizetype)&local_1f0;
      QString::fromUtf8(QVar5);
      genVulkanFunctionsH((QList<VkSpecParser::Command> *)commands_00,
                          (QMap<QString,_QList<QString>_> *)versionCommandMapping_00,
                          (QString *)CONCAT44(uVar7,in_stack_fffffffffffffd98),(QString *)in_RSI);
      genVulkanFunctionsPH
                (in_RSI,(QMap<QString,_QList<QString>_> *)
                        CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),licHeaderFn,
                 outputBase_00);
      genVulkanFunctionsPC
                (in_stack_fffffffffffffe00,
                 (QMap<QString,_QList<QString>_> *)versionCommandMapping_01,
                 (QString *)licHeaderFn_00,(QString *)outputBase_01);
      iVar8 = 0;
      QString::~QString((QString *)0x107ded);
      QString::~QString((QString *)0x107dfa);
      QList<QString>::~QList((QList<QString> *)0x107e07);
      QMap<QString,_QList<QString>_>::~QMap((QMap<QString,_QList<QString>_> *)0x107e14);
      QList<VkSpecParser::Command>::~QList((QList<VkSpecParser::Command> *)0x107e21);
    }
    else {
      iVar8 = 1;
    }
  }
  VkSpecParser::~VkSpecParser
            ((VkSpecParser *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{
    QCoreApplication app(argc, argv);
    VkSpecParser parser;

    if (argc < 4) {
        qWarning("Usage: qvkgen input_vk_xml input_license_header output_base\n"
                 "  For example: qvkgen vulkan/vk.xml vulkan/qvulkanfunctions.header vulkan/qvulkanfunctions");
        return 1;
    }

    parser.setFileName(QString::fromUtf8(argv[1]));

    if (!parser.parse())
        return 1;

    // Now we have a list of functions (commands), including extensions, and a
    // table of Version (1.0, 1.1, 1.2) -> Core functions in that version.
    QList<VkSpecParser::Command> commands = parser.commands();
    QMap<QString, QStringList> versionCommandMapping = parser.versionCommandMapping();

    QStringList ignoredFuncs {
        QStringLiteral("vkCreateInstance"),
        QStringLiteral("vkDestroyInstance"),
        QStringLiteral("vkGetInstanceProcAddr"),
        QStringLiteral("vkEnumerateInstanceVersion")
    };
    for (int i = 0; i < commands.size(); ++i) {
        if (ignoredFuncs.contains(commands[i].cmd.name))
            commands.remove(i--);
    }

    QString licenseHeaderFileName = QString::fromUtf8(argv[2]);
    QString outputBase = QString::fromUtf8(argv[3]);
    genVulkanFunctionsH(commands, versionCommandMapping, licenseHeaderFileName, outputBase);
    genVulkanFunctionsPH(commands, versionCommandMapping, licenseHeaderFileName, outputBase);
    genVulkanFunctionsPC(commands, versionCommandMapping, licenseHeaderFileName, outputBase);

    return 0;
}